

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepFaceField.h
# Opt level: O0

void __thiscall
anurbs::BrepFaceField<2L>::BrepFaceField(BrepFaceField<2L> *this,Ref<anurbs::BrepFace> *face)

{
  element_type *this_00;
  size_type __n;
  allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> local_55 [13];
  Ref<anurbs::BrepFace> local_48;
  undefined1 local_38 [16];
  Ref<anurbs::NurbsSurfaceGeometry<3L>_> local_28;
  Ref<anurbs::BrepFace> *local_18;
  Ref<anurbs::BrepFace> *face_local;
  BrepFaceField<2L> *this_local;
  
  local_18 = face;
  face_local = &this->m_face;
  Ref<anurbs::BrepFace>::Ref(&this->m_face,face);
  Ref<anurbs::BrepFace>::operator->(&local_48);
  std::__shared_ptr_access<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<anurbs::BrepFace,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_48);
  BrepFace::surface_geometry((BrepFace *)local_38);
  Ref<anurbs::NurbsSurfaceGeometry<3L>_>::operator->(&local_28);
  this_00 = std::
            __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&local_28);
  __n = NurbsSurfaceGeometry<3L>::nb_poles(this_00);
  std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::allocator(local_55);
  std::
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ::vector(&this->m_values,__n,local_55);
  std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::~allocator(local_55);
  std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>::~shared_ptr
            ((shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_> *)&local_28);
  Ref<anurbs::NurbsSurfaceGeometry<3L>_>::~Ref((Ref<anurbs::NurbsSurfaceGeometry<3L>_> *)local_38);
  std::shared_ptr<anurbs::BrepFace>::~shared_ptr((shared_ptr<anurbs::BrepFace> *)&local_48);
  return;
}

Assistant:

BrepFaceField(Ref<BrepFace> face) : m_face(face),
        m_values(face->surface_geometry()->nb_poles())
    { }